

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::Detail::
rangeToString<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>const*,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>const*>
          (string *__return_storage_ptr__,Detail *this,
          basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *first,
          basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *last)

{
  ReusableStringStream *this_00;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *e;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *e_00;
  string local_88;
  string local_68;
  undefined1 local_38 [8];
  ReusableStringStream rss;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *last_local;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *first_local;
  
  rss.m_oss = (ostream *)first;
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_38);
  ReusableStringStream::operator<<((ReusableStringStream *)local_38,(char (*) [3])"{ ");
  if (this != (Detail *)rss.m_oss) {
    stringify<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>(&local_68,this,e);
    ReusableStringStream::operator<<((ReusableStringStream *)local_38,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    for (last_local = (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)(this + 0x10);
        last_local != (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)rss.m_oss;
        last_local = last_local + 1) {
      this_00 = ReusableStringStream::operator<<
                          ((ReusableStringStream *)local_38,(char (*) [3])", ");
      stringify<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
                (&local_88,(Detail *)last_local,e_00);
      ReusableStringStream::operator<<(this_00,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
  }
  ReusableStringStream::operator<<((ReusableStringStream *)local_38,(char (*) [3])" }");
  ReusableStringStream::str_abi_cxx11_(__return_storage_ptr__,(ReusableStringStream *)local_38);
  ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string rangeToString(InputIterator first, Sentinel last) {
            ReusableStringStream rss;
            rss << "{ ";
            if (first != last) {
                rss << ::Catch::Detail::stringify(*first);
                for (++first; first != last; ++first)
                    rss << ", " << ::Catch::Detail::stringify(*first);
            }
            rss << " }";
            return rss.str();
        }